

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::GraphicsCacheTestInstance
          (GraphicsCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)23>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar5;
  VkBool32 VVar6;
  VkBool32 VVar7;
  VkShaderStageFlagBits stage;
  VkBuffer obj;
  pointer pVVar8;
  pointer pVVar9;
  Allocation *pAVar10;
  VkRenderPass obj_00;
  VkImage VVar11;
  deUint64 dVar12;
  VkImageView VVar13;
  undefined8 uVar14;
  VkFramebuffer VVar15;
  VkPipelineLayout obj_01;
  VkPipeline VVar16;
  undefined1 auVar17 [8];
  DeviceInterface *pDVar18;
  VkDevice pVVar19;
  VkAllocationCallbacks *pVVar20;
  undefined8 uVar21;
  VkDevice pVVar22;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar23;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar24;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar25;
  Handle<(vk::HandleType)17> HVar26;
  DeviceInterface *vkd;
  VkPhysicalDeviceFeatures *pVVar27;
  NotSupportedError *this_00;
  CacheTestParam *entryName;
  char *pcVar28;
  ulong uVar29;
  VkSubpassDescription subpassDescription;
  VkRenderPassCreateInfo renderPassParams;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkImageView attachmentBindInfos [2];
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *in_stack_fffffffffffffe30;
  undefined1 local_1c8 [8];
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1c0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 *local_198;
  undefined4 local_190;
  undefined8 local_188;
  VkDevice local_180;
  undefined1 local_178 [16];
  VkDevice local_168;
  VkAllocationCallbacks *pVStack_160;
  deUint32 local_158;
  VkSubpassDescription *local_150;
  deUint32 local_148;
  VkSubpassDependency *local_140;
  SimpleGraphicsPipelineBuilder *local_130;
  undefined1 local_128 [16];
  PFN_vkReallocationFunction local_118;
  VkImage VStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  VkComponentSwizzle VStack_f8;
  VkComponentSwizzle VStack_f4;
  VkImageAspectFlags VStack_f0;
  deUint32 dStack_ec;
  deUint32 dStack_e8;
  deUint32 dStack_e4;
  deUint32 local_e0;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_d0;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_c8;
  Move<vk::Handle<(vk::HandleType)8>_> *local_c0;
  DeviceInterface *local_b8;
  Move<vk::Handle<(vk::HandleType)16>_> *local_b0;
  Move<vk::Handle<(vk::HandleType)17>_> *local_a8;
  Move<vk::Handle<(vk::HandleType)13>_> *local_a0;
  Move<vk::Handle<(vk::HandleType)17>_> local_98;
  Handle<(vk::HandleType)17> local_78;
  DeviceInterface *pDStack_70;
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  Move<vk::Handle<(vk::HandleType)9>_> *local_58;
  UVec2 local_50;
  UVec2 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  CacheTestInstance::CacheTestInstance(&this->super_CacheTestInstance,context,param);
  (this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__GraphicsCacheTestInstance_00d26fd8;
  *(undefined8 *)(this->m_renderSize).m_data = 0x2000000020;
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  local_b0 = &this->m_pipelineLayout;
  pMVar1 = &this->m_depthImage;
  local_d0 = &this->m_depthImageAlloc;
  this->m_colorImageAlloc[0].super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  this->m_colorImageAlloc[1].super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_a0 = &this->m_depthAttachmentView;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  local_c0 = &this->m_vertexBuffer;
  local_c8 = &this->m_vertexBufferMemory;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = (SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_depthImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  (this->m_pipelineBuilder).m_context = context;
  (this->m_pipelineBuilder).m_patchControlPoints = 0;
  memset((this->m_pipelineBuilder).m_shaderModules,0,0xc4);
  local_a8 = &this->m_renderPass;
  memset(local_a8,0,0x120);
  local_58 = pMVar1;
  vkd = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  local_180 = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  createBufferAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,0x400,0x80,local_c8);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device = pVVar19;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator = pVVar20;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         (deUint64)auVar17;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface = pDVar18
    ;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
         (VkDevice)local_118;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_128._0_8_;
    (local_c0->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_1c0,(VkBuffer)local_1c8);
    }
  }
  createOverlappingQuads();
  pVVar8 = (this->m_vertices).
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar9 = (this->m_vertices).
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  (this->m_vertices).
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118;
  local_128._0_8_ = (void *)0x0;
  local_128._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_118 = (PFN_vkReallocationFunction)0x0;
  if ((pVVar8 != (pointer)0x0) &&
     (operator_delete(pVVar8,(long)pVVar9 - (long)pVVar8), (void *)local_128._0_8_ != (void *)0x0))
  {
    operator_delete((void *)local_128._0_8_,(long)local_118 - local_128._0_8_);
  }
  pVVar8 = (this->m_vertices).
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           ._M_impl.super__Vector_impl_data._M_start;
  memcpy(((this->m_vertexBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,pVVar8,
         (long)(this->m_vertices).
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8);
  pVVar19 = local_180;
  pAVar10 = (this->m_vertexBufferMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::flushMappedMemoryRange
            (vkd,local_180,(VkDeviceMemory)(pAVar10->m_memory).m_internal,pAVar10->m_offset,0x400);
  uStack_100._0_4_ = this->m_depthFormat;
  local_128._0_8_ = (ulong)this->m_colorFormat << 0x20;
  local_128._8_8_ = (PFN_vkAllocationFunction)0x100000001;
  local_118 = (PFN_vkReallocationFunction)0x200000000;
  VStack_110.m_internal = 0x200000001;
  local_108 = (PFN_vkInternalAllocationNotification)0x2;
  uStack_100._4_4_ = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_f8 = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_f4 = VK_COMPONENT_SWIZZLE_ZERO;
  VStack_f0 = 2;
  dStack_ec = 1;
  dStack_e8 = 3;
  dStack_e4 = 3;
  local_1a8 = &local_38;
  local_38 = 0x200000000;
  local_198 = &local_40;
  local_40 = 0x300000001;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface =
       (DeviceInterface *)((ulong)DStack_1c0.m_deviceIface & 0xffffffff00000000);
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)CONCAT44(DStack_1c0.m_allocator._4_4_,1);
  local_1a0 = 0;
  local_190 = 0;
  local_188 = 0;
  local_178._0_4_ = 0x26;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x200000000;
  local_158 = 1;
  local_148 = 0;
  local_140 = (VkSubpassDependency *)0x0;
  pVStack_160 = (VkAllocationCallbacks *)local_128;
  local_150 = (VkSubpassDescription *)local_1c8;
  ::vk::createRenderPass
            (&local_98,vkd,pVVar19,(VkRenderPassCreateInfo *)local_178,(VkAllocationCallbacks *)0x0)
  ;
  pVVar20 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  pVVar19 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  pDVar18 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  HVar26.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pMVar25 = local_a0;
  pMVar24 = local_a8;
  local_68 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  pVStack_60 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  local_78.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  pDStack_70 = local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (local_a8->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (local_a8->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device = pVVar19;
    (local_a8->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator = pVVar20;
    (local_a8->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         HVar26.m_internal;
    (local_a8->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
         pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_00);
    (pMVar24->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device = local_68;
    (pMVar24->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator =
         pVStack_60;
    (pMVar24->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         local_78.m_internal;
    (pMVar24->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
         pDStack_70;
    if (local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkRenderPass)
                 local_98.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
    }
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1c8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,(int)this + 0xf8,
             in_stack_fffffffffffffe30);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  pMVar2 = this->m_colorImage;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar11.m_internal =
       (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (VVar11.m_internal == 0) {
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         pVVar19;
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVVar20;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         (deUint64)auVar17;
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar11);
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)local_118;
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_128._0_8_;
    this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1c0,(VkImage)local_1c8);
    }
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1c8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_colorFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x11,(int)this + 0x108,
             in_stack_fffffffffffffe30);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  pMVar2 = this->m_colorImage + 1;
  VVar11.m_internal =
       this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar11.m_internal == 0) {
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         pVVar19;
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVVar20;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         (deUint64)auVar17;
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar11);
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)local_118;
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_128._0_8_;
    this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1c0,(VkImage)local_1c8);
    }
  }
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)local_1c8,
             (this->super_CacheTestInstance).super_TestInstance.m_context,this->m_depthFormat,
             (this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],0x20,
             (VkSampleCountFlagBits)local_d0,in_stack_fffffffffffffe30);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar11.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (VVar11.m_internal == 0) {
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         pVVar19;
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVVar20;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         (deUint64)auVar17;
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar11);
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)local_118;
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_128._0_8_;
    (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&DStack_1c0,(VkImage)local_1c8);
    }
  }
  VStack_110.m_internal =
       this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  this->m_imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[0].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[0].srcAccessMask = 0;
  this->m_imageLayoutBarriers[0].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[0].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].image.m_internal = VStack_110.m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  dVar12 = this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
           m_internal;
  this->m_imageLayoutBarriers[1].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar12;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  dVar12 = (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
           m_internal;
  this->m_imageLayoutBarriers[2].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[2].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[2].srcAccessMask = 0;
  this->m_imageLayoutBarriers[2].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[2].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[2].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[2].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].image.m_internal = dVar12;
  this->m_imageLayoutBarriers[2].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[2].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[2].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.layerCount = 1;
  local_128._0_4_ = 0xf;
  local_128._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_118 = (PFN_vkReallocationFunction)((ulong)local_118 & 0xffffffff00000000);
  local_108 = (PFN_vkInternalAllocationNotification)CONCAT44(this->m_colorFormat,1);
  uStack_100._0_4_ = VK_COMPONENT_SWIZZLE_R;
  uStack_100._4_4_ = VK_COMPONENT_SWIZZLE_G;
  VStack_f8 = VK_COMPONENT_SWIZZLE_B;
  VStack_f4 = VK_COMPONENT_SWIZZLE_A;
  VStack_f0 = 1;
  dStack_ec = 0;
  dStack_e8 = 1;
  dStack_e4 = 0;
  local_e0 = 1;
  local_b8 = vkd;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_178,vkd,local_180,
             (VkImageViewCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pVVar20 = pVStack_160;
  pVVar19 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  pMVar3 = this->m_colorAttachmentView;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  VVar13.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar13.m_internal == 0) {
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = pVVar19;
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = pVVar20;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar14;
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
                .deleter,VVar13);
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = DStack_1c0.m_device;
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = DStack_1c0.m_allocator;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)local_1c8;
    this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_178 + 8),
                 (VkImageView)local_178._0_8_);
    }
  }
  pDVar18 = local_b8;
  VStack_110.m_internal =
       (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_178,local_b8,local_180,
             (VkImageViewCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pVVar20 = pVStack_160;
  pVVar19 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  pMVar3 = this->m_colorAttachmentView + 1;
  VVar13.m_internal =
       this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar13.m_internal == 0) {
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = pVVar19;
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = pVVar20;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar14;
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
                .deleter,VVar13);
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = DStack_1c0.m_device;
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = DStack_1c0.m_allocator;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)local_1c8;
    this->m_colorAttachmentView[1].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_178 + 8),
                 (VkImageView)local_178._0_8_);
    }
  }
  local_128._0_4_ = 0xf;
  local_128._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_118 = (PFN_vkReallocationFunction)((ulong)local_118 & 0xffffffff00000000);
  VStack_110.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_108 = (PFN_vkInternalAllocationNotification)CONCAT44(this->m_depthFormat,1);
  uStack_100._0_4_ = VK_COMPONENT_SWIZZLE_R;
  uStack_100._4_4_ = VK_COMPONENT_SWIZZLE_G;
  VStack_f8 = VK_COMPONENT_SWIZZLE_B;
  VStack_f4 = VK_COMPONENT_SWIZZLE_A;
  VStack_f0 = 2;
  dStack_ec = 0;
  dStack_e8 = 1;
  dStack_e4 = 0;
  local_e0 = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_178,pDVar18,local_180,
             (VkImageViewCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pVVar20 = pVStack_160;
  pVVar19 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  VVar13.m_internal =
       (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar13.m_internal == 0) {
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = pVVar19;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVVar20;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar14;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar13);
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         DStack_1c0.m_device;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         DStack_1c0.m_allocator;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         (deUint64)local_1c8;
    (pMVar25->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_178 + 8),
                 (VkImageView)local_178._0_8_);
    }
  }
  pVVar19 = local_180;
  local_78.m_internal =
       this->m_colorAttachmentView[0].super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  uStack_100 = (VkPushConstantRange *)&local_78;
  pDStack_70 = (DeviceInterface *)
               (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
               object.m_internal;
  local_128._0_4_ = 0x25;
  local_128._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_118 = (PFN_vkReallocationFunction)((ulong)local_118 & 0xffffffff00000000);
  VStack_110.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_108 = (PFN_vkInternalAllocationNotification)CONCAT44(local_108._4_4_,2);
  uVar14 = *(undefined8 *)(this->m_renderSize).m_data;
  VStack_f8 = (VkComponentSwizzle)uVar14;
  VStack_f4 = (VkComponentSwizzle)((ulong)uVar14 >> 0x20);
  VStack_f0 = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_178,pDVar18,local_180,
             (VkFramebufferCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pVVar20 = pVStack_160;
  pVVar22 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  pMVar4 = this->m_framebuffer;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  VVar15.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal;
  if (VVar15.m_internal == 0) {
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         pVVar22;
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = pVVar20;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal = uVar14;
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter
               ,VVar15);
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         DStack_1c0.m_device;
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = DStack_1c0.m_allocator;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
         (deUint64)local_1c8;
    this->m_framebuffer[0].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_178 + 8),
                 (VkFramebuffer)local_178._0_8_);
    }
  }
  local_78.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)local_178,local_b8,pVVar19,
             (VkFramebufferCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pVVar20 = pVStack_160;
  pVVar19 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  VVar15.m_internal =
       this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  if (VVar15.m_internal == 0) {
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         pVVar19;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = pVVar20;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         uVar14;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter
               ,VVar15);
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
         DStack_1c0.m_device;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
         = DStack_1c0.m_allocator;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
         (deUint64)local_1c8;
    this->m_framebuffer[1].super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_178 + 8),
                 (VkFramebuffer)local_178._0_8_);
    }
  }
  pVVar27 = Context::getDeviceFeatures((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  entryName = (this->super_CacheTestInstance).m_param;
  if ((int)entryName->m_shaderCount != 0) {
    VVar6 = pVVar27->geometryShader;
    VVar7 = pVVar27->tessellationShader;
    uVar29 = 0;
    do {
      stage = entryName->m_shaders[uVar29];
      pcVar28 = "color_vert";
      switch(stage) {
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
        pcVar28 = "basic_tcs";
        if (VVar7 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Tessellation Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x3fe);
LAB_0049d1e5:
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        goto LAB_0049ced2;
      case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
           VK_SHADER_STAGE_VERTEX_BIT:
        break;
      case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
        pcVar28 = "basic_tes";
        if (VVar7 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Tessellation Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x409);
          goto LAB_0049d1e5;
        }
LAB_0049ced2:
        SimpleGraphicsPipelineBuilder::bindShaderStage(local_130,stage,pcVar28,(char *)entryName);
        (this->m_pipelineBuilder).m_patchControlPoints = 3;
        break;
      case VK_SHADER_STAGE_GEOMETRY_BIT:
        pcVar28 = "dummy_geo";
        if (VVar6 == 0) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Geometry Shader Not Supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                     ,0x3f4);
          goto LAB_0049d1e5;
        }
      case VK_SHADER_STAGE_VERTEX_BIT:
switchD_0049cea1_caseD_1:
        SimpleGraphicsPipelineBuilder::bindShaderStage(local_130,stage,pcVar28,(char *)entryName);
        break;
      default:
        if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
          pcVar28 = "color_frag";
          goto switchD_0049cea1_caseD_1;
        }
      }
      uVar29 = uVar29 + 1;
      entryName = (this->super_CacheTestInstance).m_param;
    } while (uVar29 < (uint)entryName->m_shaderCount);
  }
  local_128._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_108 = (PFN_vkInternalAllocationNotification)0x0;
  uStack_100._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_100._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_118 = (PFN_vkReallocationFunction)0x0;
  VStack_110.m_internal = 0;
  local_128._0_8_ = (void *)0x1e;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_178,local_b8,local_180,
             (VkPipelineLayoutCreateInfo *)local_128,(VkAllocationCallbacks *)0x0);
  pMVar23 = local_b0;
  pVVar20 = pVStack_160;
  pVVar19 = local_168;
  uVar21 = local_178._8_8_;
  uVar14 = local_178._0_8_;
  DStack_1c0.m_device = local_168;
  DStack_1c0.m_allocator = pVStack_160;
  local_1c8 = (undefined1  [8])local_178._0_8_;
  DStack_1c0.m_deviceIface = (DeviceInterface *)local_178._8_8_;
  local_178._0_8_ = 0;
  local_178._8_8_ = (DeviceInterface *)0x0;
  local_168 = (VkDevice)0x0;
  pVStack_160 = (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (local_b0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  if (obj_01.m_internal == 0) {
    (local_b0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device = pVVar19;
    (local_b0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator = pVVar20;
    (local_b0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar14;
    (local_b0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_01);
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
         DStack_1c0.m_device;
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
         DStack_1c0.m_allocator;
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
         (deUint64)local_1c8;
    (pMVar23->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
         DStack_1c0.m_deviceIface;
    if (local_178._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_178 + 8),
                 (VkPipelineLayout)local_178._0_8_);
    }
  }
  local_48.m_data = *&(this->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1c8,local_130,&local_48,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             (this->super_CacheTestInstance).m_cache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
             m_data.object.m_internal,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  pMVar5 = this->m_pipeline;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar16.m_internal =
       (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  if (VVar16.m_internal == 0) {
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar19;
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         pVVar20;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         (deUint64)auVar17;
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
         = pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               VVar16);
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_118;
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         local_128._0_8_;
    this->m_pipeline[0].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&DStack_1c0,(VkPipeline)local_1c8);
    }
  }
  local_50.m_data = *&(this->m_renderSize).m_data;
  SimpleGraphicsPipelineBuilder::buildPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1c8,local_130,&local_50,
             (VkRenderPass)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal,
             (VkPipelineCache)
             (this->super_CacheTestInstance).m_cache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.
             m_data.object.m_internal,
             (VkPipelineLayout)
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal);
  pVVar20 = DStack_1c0.m_allocator;
  pVVar19 = DStack_1c0.m_device;
  pDVar18 = DStack_1c0.m_deviceIface;
  auVar17 = local_1c8;
  local_118 = (PFN_vkReallocationFunction)DStack_1c0.m_device;
  VStack_110.m_internal = (deUint64)DStack_1c0.m_allocator;
  local_128._0_8_ = local_1c8;
  local_128._8_8_ = DStack_1c0.m_deviceIface;
  local_1c8 = (undefined1  [8])0x0;
  DStack_1c0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1c0.m_device = (VkDevice)0x0;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)0x0;
  VVar16.m_internal =
       this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (VVar16.m_internal == 0) {
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar19;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         pVVar20;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         (deUint64)auVar17;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
         = pDVar18;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               VVar16);
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_118;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_110.m_internal;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_128._0_8_;
    this->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_128._8_8_;
    if (local_1c8 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&DStack_1c0,(VkPipeline)local_1c8);
    }
  }
  return;
}

Assistant:

GraphicsCacheTestInstance::GraphicsCacheTestInstance (Context&              context,
													  const CacheTestParam* param)
	: CacheTestInstance (context,param)
	, m_renderSize      (32u, 32u)
	, m_colorFormat     (VK_FORMAT_R8G8B8A8_UNORM)
	, m_depthFormat     (VK_FORMAT_D16_UNORM)
	, m_pipelineBuilder (context)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(m_context, 1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferMemory);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferMemory->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset(), 1024u);
	}

	// Create render pass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags    flags;
			m_colorFormat,                                      // VkFormat                        format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits           samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp              loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,                       // VkAttachmentStoreOp             storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp              stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp             stencilStoreOp;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   finalLayout;
		};

		const VkAttachmentDescription depthAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags flags;
			m_depthFormat,                                      // VkFormat                     format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits        samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp           loadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp           stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          stencilStoreOp;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                initialLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                finalLayout;
		};

		const VkAttachmentDescription attachments[2] =
		{
			colorAttachmentDescription,
			depthAttachmentDescription
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL            // VkImageLayout    layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			1u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL    // VkImageLayout    layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			0u,                                                 // VkSubpassDescriptionFlags        flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,                    // VkPipelineBindPoint              pipelineBindPoint;
			0u,                                                 // deUint32                         inputAttachmentCount;
			DE_NULL,                                            // const VkAttachmentReference*     pInputAttachments;
			1u,                                                 // deUint32                         colorAttachmentCount;
			&colorAttachmentReference,                          // const VkAttachmentReference*     pColorAttachments;
			DE_NULL,                                            // const VkAttachmentReference*     pResolveAttachments;
			&depthAttachmentReference,                          // const VkAttachmentReference*     pDepthStencilAttachment;
			0u,                                                 // deUint32                         preserveAttachmentCount;
			DE_NULL                                             // const VkAttachmentReference*     pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,          // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkRenderPassCreateFlags          flags;
			2u,                                                 // deUint32                         attachmentCount;
			attachments,                                        // const VkAttachmentDescription*   pAttachments;
			1u,                                                 // deUint32                         subpassCount;
			&subpassDescription,                                // const VkSubpassDescription*      pSubpasses;
			0u,                                                 // deUint32                         dependencyCount;
			DE_NULL                                             // const VkSubpassDependency*       pDependencies;
		};

		m_renderPass = createRenderPass(vk, vkDevice, &renderPassParams);
	}

	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};
	// Create color image
	{
		m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE] = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_NO_CACHE]);
		m_colorImage[PIPELINE_CACHE_NDX_CACHED]   = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_CACHED]);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(m_context,
												  m_depthFormat,
												  m_renderSize.x(),
												  m_renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],			// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;

		colorImageBarrier.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_imageLayoutBarriers[1] = colorImageBarrier;

		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[2] = depthImageBarrier;
	}
	// Create color attachment view
	{
		VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],     // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_colorFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE] = createImageView(vk, vkDevice, &colorAttachmentViewParams);

		colorAttachmentViewParams.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED] = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_depthFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE],
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)m_renderSize.x(),                         // deUint32                     width;
			(deUint32)m_renderSize.y(),                         // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE] = createFramebuffer(vk, vkDevice, &framebufferParams);

		attachmentBindInfos[0] = *m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED];
		m_framebuffer[PIPELINE_CACHE_NDX_CACHED] = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

	// Bind shader stages
	VkPhysicalDeviceFeatures  features = m_context.getDeviceFeatures();
	for (deUint32 shaderNdx = 0; shaderNdx < m_param->getShaderCount(); shaderNdx++)
	{
		switch(m_param->getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
				break;
			case VK_SHADER_STAGE_FRAGMENT_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");
				break;
			case VK_SHADER_STAGE_GEOMETRY_BIT:
				if (features.geometryShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Geometry Shader Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_GEOMETRY_BIT, "dummy_geo", "main");
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT, "basic_tcs", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, "basic_tes", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkPipelineLayoutCreateFlags		flags;
			0u,													// deUint32							setLayoutCount;
			DE_NULL,											// const VkDescriptorSetLayout*		pSetLayouts;
			0u,													// deUint32							pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*		pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
	m_pipeline[PIPELINE_CACHE_NDX_CACHED]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
}